

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPMRenderer.cpp
# Opt level: O3

Color * __thiscall
PPMRenderer::calcRefr
          (Color *__return_storage_ptr__,PPMRenderer *this,Collision *collision,Ray *ray,int depth,
          Color *weight,bool inside,int *hashId,
          vector<RtHitPoint,_std::allocator<RtHitPoint>_> *hitPoints,Mat *img)

{
  Primitive *pPVar1;
  char *pcVar2;
  bool bVar3;
  Color *pCVar4;
  int iVar5;
  double __x;
  double n;
  bool new_inside;
  double local_188;
  PPMRenderer *local_180;
  Color *local_178;
  Vector3 new_weight;
  Vector3 local_140;
  Ray newRay;
  double local_f8;
  double dStack_f0;
  double local_e8;
  Vector3 local_e0;
  Mat local_c8 [96];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  pPVar1 = collision->primitive;
  n = pPVar1->rindex;
  local_180 = this;
  local_178 = __return_storage_ptr__;
  if (inside) {
    pcVar2 = *(char **)(pPVar1->_vptr_Primitive[-1] + 8);
    if (pcVar2 != "6Bezier") {
      if (*pcVar2 != '*') {
        local_188 = n;
        iVar5 = strcmp(pcVar2,"6Bezier");
        n = local_188;
        if (iVar5 == 0) goto LAB_00113903;
      }
      n = 1.0 / n;
    }
  }
LAB_00113903:
  Ray::refracted(&newRay,ray,&collision->P,&collision->N,n,&new_inside);
  pcVar2 = *(char **)(pPVar1->_vptr_Primitive[-1] + 8);
  if (pcVar2 == "6Bezier") {
LAB_0011394b:
    new_inside = false;
  }
  else if (*pcVar2 != '*') {
    iVar5 = strcmp(pcVar2,"6Bezier");
    if (iVar5 == 0) goto LAB_0011394b;
  }
  new_inside = new_inside != inside;
  operator*(weight,&pPVar1->refr);
  if ((inside) && (pcVar2 = *(char **)(pPVar1->_vptr_Primitive[-1] + 8), pcVar2 != "6Bezier")) {
    if (*pcVar2 != '*') {
      iVar5 = strcmp(pcVar2,"6Bezier");
      if (iVar5 == 0) goto LAB_001139e3;
    }
    local_e0.x._0_4_ = *(undefined4 *)&collision->dist;
    local_e0.x._4_4_ = *(uint *)((long)&collision->dist + 4) ^ 0x80000000;
    local_e0.y._0_4_ = local_e0.x._0_4_;
    local_e0.y._4_4_ = local_e0.x._4_4_;
    local_e0.z._0_4_ = local_e0.x._0_4_;
    local_e0.z._4_4_ = local_e0.x._4_4_;
    operator*(&local_e0,&pPVar1->absor);
    exp(__x);
    operator*=(&new_weight,&local_140);
  }
LAB_001139e3:
  bVar3 = new_inside;
  local_48 = newRay.V.y;
  dStack_40 = newRay.V.z;
  local_58 = newRay.O.z;
  dStack_50 = newRay.V.x;
  local_68 = newRay.O.x;
  dStack_60 = newRay.O.y;
  local_f8 = new_weight.x;
  dStack_f0 = new_weight.y;
  local_e8 = new_weight.z;
  cv::Mat::Mat(local_c8,img);
  pCVar4 = local_178;
  rayTrace(local_178,local_180,&local_68,depth + -1,&local_f8,bVar3,hashId,hitPoints,local_c8);
  cv::Mat::~Mat(local_c8);
  return pCVar4;
}

Assistant:

Color
PPMRenderer::calcRefr(const Collision &collision, const Ray &ray, int depth, const Color &weight, bool inside,
                      int &hashId, std::vector<RtHitPoint> &hitPoints, Mat &img)
{
    Primitive *primitive = collision.primitive;
    double n = primitive->rindex;
    if (inside && typeid(*primitive) != typeid(Bezier)) n = 1 / n;
    bool new_inside;
    Ray newRay = ray.refracted(collision.P, collision.N, n, new_inside);
    if (typeid(*primitive) == typeid(Bezier)) new_inside = 0;
    new_inside ^= inside;
    Vector3 new_weight = weight * primitive->refr;
    if (inside && typeid(*primitive) != typeid(Bezier))
        new_weight *= exp(-collision.dist * primitive->absor);
    return rayTrace(newRay, depth - 1, new_weight, new_inside, hashId, hitPoints, img);
}